

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O2

uint8_t * find_bytes(uint8_t *buffer,size_t bufferSize,uint8_t *pattern,size_t patternSize)

{
  int *piVar1;
  
  while( true ) {
    piVar1 = (int *)memchr(buffer,0,bufferSize);
    if (bufferSize < 4) {
      return (uint8_t *)0x0;
    }
    if (piVar1 == (int *)0x0) break;
    if (*piVar1 == -0x10000) {
      return (uint8_t *)piVar1;
    }
    buffer = (uint8_t *)((long)piVar1 + 1);
    bufferSize = bufferSize - 1;
  }
  return (uint8_t *)0x0;
}

Assistant:

static uint8_t* find_bytes(
    const uint8_t* buffer, size_t bufferSize, 
    const uint8_t* pattern, size_t patternSize)
{
  const unsigned char *p = buffer;
  size_t buffer_left = bufferSize;
  while ((p = memchr(p, pattern[0], buffer_left)) != NULL)
  {
    if (patternSize > buffer_left)
      break;

    if (memcmp(p, pattern, patternSize) == 0)
      return (uint8_t*)p;

    ++p;
    --buffer_left;
  }

  return NULL;
}